

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

void vsencoding::__vseblocks_unpack8(uint32_t *out,uint32_t *in,uint32_t bs)

{
  uint32_t bs_local;
  uint32_t *in_local;
  uint32_t *out_local;
  
  in_local = in;
  out_local = out;
  for (bs_local = bs + 0x1f >> 5; bs_local != 0; bs_local = bs_local - 1) {
    *out_local = *in_local >> 0x18;
    out_local[1] = *in_local >> 0x10 & 0xff;
    out_local[2] = *in_local >> 8 & 0xff;
    out_local[3] = *in_local & 0xff;
    out_local[4] = in_local[1] >> 0x18;
    out_local[5] = in_local[1] >> 0x10 & 0xff;
    out_local[6] = in_local[1] >> 8 & 0xff;
    out_local[7] = in_local[1] & 0xff;
    out_local[8] = in_local[2] >> 0x18;
    out_local[9] = in_local[2] >> 0x10 & 0xff;
    out_local[10] = in_local[2] >> 8 & 0xff;
    out_local[0xb] = in_local[2] & 0xff;
    out_local[0xc] = in_local[3] >> 0x18;
    out_local[0xd] = in_local[3] >> 0x10 & 0xff;
    out_local[0xe] = in_local[3] >> 8 & 0xff;
    out_local[0xf] = in_local[3] & 0xff;
    out_local[0x10] = in_local[4] >> 0x18;
    out_local[0x11] = in_local[4] >> 0x10 & 0xff;
    out_local[0x12] = in_local[4] >> 8 & 0xff;
    out_local[0x13] = in_local[4] & 0xff;
    out_local[0x14] = in_local[5] >> 0x18;
    out_local[0x15] = in_local[5] >> 0x10 & 0xff;
    out_local[0x16] = in_local[5] >> 8 & 0xff;
    out_local[0x17] = in_local[5] & 0xff;
    out_local[0x18] = in_local[6] >> 0x18;
    out_local[0x19] = in_local[6] >> 0x10 & 0xff;
    out_local[0x1a] = in_local[6] >> 8 & 0xff;
    out_local[0x1b] = in_local[6] & 0xff;
    out_local[0x1c] = in_local[7] >> 0x18;
    out_local[0x1d] = in_local[7] >> 0x10 & 0xff;
    out_local[0x1e] = in_local[7] >> 8 & 0xff;
    out_local[0x1f] = in_local[7] & 0xff;
    out_local = out_local + 0x20;
    in_local = in_local + 8;
  }
  return;
}

Assistant:

void __vseblocks_unpack8(uint32_t *__restrict__ out,
                         const uint32_t *__restrict__ in, uint32_t bs) {
  for (bs = (bs + 31U) / 32U; bs > 0; out += 32, in += 8, --bs) {
    out[0] = in[0] >> 24;
    out[1] = (in[0] >> 16) & 0xff;
    out[2] = (in[0] >> 8) & 0xff;
    out[3] = in[0] & 0xff;
    out[4] = in[1] >> 24;
    out[5] = (in[1] >> 16) & 0xff;
    out[6] = (in[1] >> 8) & 0xff;
    out[7] = in[1] & 0xff;
    out[8] = in[2] >> 24;
    out[9] = (in[2] >> 16) & 0xff;
    out[10] = (in[2] >> 8) & 0xff;
    out[11] = in[2] & 0xff;
    out[12] = in[3] >> 24;
    out[13] = (in[3] >> 16) & 0xff;
    out[14] = (in[3] >> 8) & 0xff;
    out[15] = in[3] & 0xff;
    out[16] = in[4] >> 24;
    out[17] = (in[4] >> 16) & 0xff;
    out[18] = (in[4] >> 8) & 0xff;
    out[19] = in[4] & 0xff;
    out[20] = in[5] >> 24;
    out[21] = (in[5] >> 16) & 0xff;
    out[22] = (in[5] >> 8) & 0xff;
    out[23] = in[5] & 0xff;
    out[24] = in[6] >> 24;
    out[25] = (in[6] >> 16) & 0xff;
    out[26] = (in[6] >> 8) & 0xff;
    out[27] = in[6] & 0xff;
    out[28] = in[7] >> 24;
    out[29] = (in[7] >> 16) & 0xff;
    out[30] = (in[7] >> 8) & 0xff;
    out[31] = in[7] & 0xff;
  }
}